

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O3

LogMessage * __thiscall
absl::lts_20250127::log_internal::LogMessage::AtLocation(LogMessage *this,string_view file,int line)

{
  LogMessageData *pLVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  
  pcVar5 = file._M_str;
  sVar4 = file._M_len;
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
  (pLVar1->entry).full_filename_._M_len = sVar4;
  *(char **)((long)&(pLVar1->entry).full_filename_ + 8) = pcVar5;
  if (sVar4 == 0) {
    sVar4 = 0;
  }
  else {
    lVar6 = -1;
    sVar3 = 0xffffffffffffffff;
    do {
      if (sVar3 - sVar4 == -1) goto LAB_002ada5f;
      sVar3 = sVar3 + 1;
      lVar2 = lVar6 + sVar4;
      lVar6 = lVar6 + -1;
    } while (pcVar5[lVar2] != '/');
    pcVar5 = pcVar5 + (sVar4 - sVar3);
    sVar4 = sVar3;
  }
LAB_002ada5f:
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
  (pLVar1->entry).base_filename_._M_len = sVar4;
  *(char **)((long)&(pLVar1->entry).base_filename_ + 8) = pcVar5;
  (((this->data_)._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
   _M_head_impl)->entry).line_ = line;
  LogBacktraceIfNeeded(this);
  return this;
}

Assistant:

LogMessage& LogMessage::AtLocation(absl::string_view file, int line) {
  data_->entry.full_filename_ = file;
  data_->entry.base_filename_ = Basename(file);
  data_->entry.line_ = line;
  LogBacktraceIfNeeded();
  return *this;
}